

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall
SubcommandProgram_Multiple_Test::~SubcommandProgram_Multiple_Test
          (SubcommandProgram_Multiple_Test *this)

{
  SubcommandProgram::~SubcommandProgram(&this->super_SubcommandProgram);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, Multiple) {
    args = {"-d", "start", "-ffilename", "stop"};

    run();
    EXPECT_EQ((size_t)2, app.get_subcommands().size());
    EXPECT_EQ(1, dummy);
    EXPECT_EQ("filename", file);
}